

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

tm * __thiscall spdlog::pattern_formatter::get_time_(pattern_formatter *this,log_msg *msg)

{
  long in_RSI;
  tm *in_RDI;
  time_point *in_stack_ffffffffffffffe0;
  time_t local_18 [3];
  
  if (*(int *)(in_RSI + 0x48) == 0) {
    local_18[0] = std::chrono::_V2::system_clock::to_time_t(in_stack_ffffffffffffffe0);
    details::os::localtime((os *)in_RDI,local_18);
  }
  else {
    std::chrono::_V2::system_clock::to_time_t(in_stack_ffffffffffffffe0);
    details::os::gmtime((os *)in_RDI,(time_t *)&stack0xffffffffffffffe0);
  }
  return in_RDI;
}

Assistant:

std::tm get_time_(const details::log_msg &msg)
    {
        if (pattern_time_type_ == pattern_time_type::local)
        {
            return details::os::localtime(log_clock::to_time_t(msg.time));
        }
        return details::os::gmtime(log_clock::to_time_t(msg.time));
    }